

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O0

void av1_count_colors(uint8_t *src,int stride,int rows,int cols,int *val_count,int *num_colors)

{
  int in_ECX;
  long lVar1;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  void *in_R8;
  int *in_R9;
  int i;
  int n;
  int this_val;
  int c;
  int r;
  int max_pix_val;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_34;
  undefined4 local_30;
  
  memset(in_R8,0,0x400);
  for (local_30 = 0; local_30 < in_EDX; local_30 = local_30 + 1) {
    for (local_34 = 0; local_34 < in_ECX; local_34 = local_34 + 1) {
      lVar1 = (long)(int)(uint)*(byte *)(in_RDI + (local_30 * in_ESI + local_34));
      *(int *)((long)in_R8 + lVar1 * 4) = *(int *)((long)in_R8 + lVar1 * 4) + 1;
    }
  }
  local_3c = 0;
  for (local_40 = 0; local_40 < 0x100; local_40 = local_40 + 1) {
    if (*(int *)((long)in_R8 + (long)local_40 * 4) != 0) {
      local_3c = local_3c + 1;
    }
  }
  *in_R9 = local_3c;
  return;
}

Assistant:

void av1_count_colors(const uint8_t *src, int stride, int rows, int cols,
                      int *val_count, int *num_colors) {
  const int max_pix_val = 1 << 8;
  memset(val_count, 0, max_pix_val * sizeof(val_count[0]));
  for (int r = 0; r < rows; ++r) {
    for (int c = 0; c < cols; ++c) {
      const int this_val = src[r * stride + c];
      assert(this_val < max_pix_val);
      ++val_count[this_val];
    }
  }
  int n = 0;
  for (int i = 0; i < max_pix_val; ++i) {
    if (val_count[i]) ++n;
  }
  *num_colors = n;
}